

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ec30ed::AV1FwdTxfm2dTest_DCTScaleTest_Test::TestBody
          (AV1FwdTxfm2dTest_DCTScaleTest_Test *this)

{
  bool bVar1;
  int iVar2;
  __type _Var3;
  AssertionResult gtest_ar;
  double scale;
  int j_1;
  double output_sse;
  double input_sse;
  int j;
  int array_size;
  int stride;
  TX_SIZE tx_size;
  int i;
  int ref_scale_list [4];
  int stride_list [4];
  TX_SIZE tx_size_list [4];
  tran_low_t coeff [1024];
  int16_t src_diff [1024];
  BitDepthInfo bd_info;
  AssertHelper *in_stack_ffffffffffffe708;
  tran_low_t *in_stack_ffffffffffffe718;
  int in_stack_ffffffffffffe724;
  int16_t *in_stack_ffffffffffffe728;
  TX_SIZE in_stack_ffffffffffffe733;
  Type in_stack_ffffffffffffe734;
  BitDepthInfo in_stack_ffffffffffffe738;
  AssertionResult local_18c0;
  double local_18b0;
  int local_18a4;
  double local_18a0;
  double local_1898;
  undefined8 local_188c;
  int local_1884;
  int iVar4;
  undefined4 in_stack_ffffffffffffe788;
  int iVar5;
  int local_1860 [7];
  undefined4 local_1844;
  undefined4 local_1840 [66];
  double in_stack_ffffffffffffe8c8;
  double in_stack_ffffffffffffe8d0;
  double in_stack_ffffffffffffe8d8;
  char *in_stack_ffffffffffffe8e0;
  char *in_stack_ffffffffffffe8e8;
  char *in_stack_ffffffffffffe8f0;
  undefined2 local_840 [1024];
  undefined4 local_40;
  undefined4 uStack_3c;
  
  local_40 = 8;
  uStack_3c = 0;
  local_1844 = 0x3020100;
  local_1860[0] = 4;
  local_1860[1] = 8;
  local_1860[2] = 0x10;
  local_1860[3] = 0x20;
  for (iVar5 = 0; iVar5 < 4; iVar5 = iVar5 + 1) {
    in_stack_ffffffffffffe788 =
         CONCAT13(*(undefined1 *)((long)local_1840 + (long)iVar5 + -4),
                  (int3)in_stack_ffffffffffffe788);
    iVar4 = local_1860[iVar5];
    iVar2 = iVar4 * iVar4;
    for (local_1884 = 0; local_1884 < iVar2; local_1884 = local_1884 + 1) {
      local_840[local_1884] = 8;
      local_1840[local_1884] = 0;
    }
    local_188c = CONCAT44(uStack_3c,local_40);
    av1_quick_txfm(in_stack_ffffffffffffe734,in_stack_ffffffffffffe733,in_stack_ffffffffffffe738,
                   in_stack_ffffffffffffe728,in_stack_ffffffffffffe724,in_stack_ffffffffffffe718);
    local_1898 = 0.0;
    local_18a0 = 0.0;
    for (local_18a4 = 0; local_18a4 < iVar2; local_18a4 = local_18a4 + 1) {
      _Var3 = std::pow<short,int>(0,0x9c526b);
      local_1898 = _Var3 + local_1898;
      _Var3 = std::pow<int,int>(0,0x9c528d);
      local_18a0 = _Var3 + local_18a0;
    }
    local_18b0 = local_18a0 / local_1898;
    testing::internal::DoubleNearPredFormat
              (in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,in_stack_ffffffffffffe8e0,
               in_stack_ffffffffffffe8d8,in_stack_ffffffffffffe8d0,in_stack_ffffffffffffe8c8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18c0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffe738);
      in_stack_ffffffffffffe718 =
           (tran_low_t *)testing::AssertionResult::failure_message((AssertionResult *)0x9c5321);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_ffffffffffffe738,in_stack_ffffffffffffe734,
                 (char *)in_stack_ffffffffffffe728,in_stack_ffffffffffffe724,
                 (char *)in_stack_ffffffffffffe718);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(iVar5,in_stack_ffffffffffffe788),
                 (Message *)CONCAT44(iVar4,iVar2));
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffe708);
      testing::Message::~Message((Message *)0x9c536f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x9c53bf);
  }
  return;
}

Assistant:

TEST(AV1FwdTxfm2dTest, DCTScaleTest) {
  BitDepthInfo bd_info;
  bd_info.bit_depth = 8;
  bd_info.use_highbitdepth_buf = 0;
  DECLARE_ALIGNED(32, int16_t, src_diff[1024]);
  DECLARE_ALIGNED(32, tran_low_t, coeff[1024]);

  const TX_SIZE tx_size_list[4] = { TX_4X4, TX_8X8, TX_16X16, TX_32X32 };
  const int stride_list[4] = { 4, 8, 16, 32 };
  const int ref_scale_list[4] = { 64, 64, 64, 16 };

  for (int i = 0; i < 4; i++) {
    TX_SIZE tx_size = tx_size_list[i];
    int stride = stride_list[i];
    int array_size = stride * stride;

    for (int j = 0; j < array_size; j++) {
      src_diff[j] = 8;
      coeff[j] = 0;
    }

    av1_quick_txfm(/*use_hadamard=*/0, tx_size, bd_info, src_diff, stride,
                   coeff);

    double input_sse = 0;
    double output_sse = 0;
    for (int j = 0; j < array_size; j++) {
      input_sse += pow(src_diff[j], 2);
      output_sse += pow(coeff[j], 2);
    }

    double scale = output_sse / input_sse;

    EXPECT_NEAR(scale, ref_scale_list[i], 5);
  }
}